

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

Matrix<float,_3,_3> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,3,3>
          (Matrix<float,_3,_3> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_3> *a,
          Vector<float,_3> *b)

{
  float fVar1;
  int r;
  long lVar2;
  tcu *ptVar3;
  Matrix<float,_3,_3> *extraout_RDX;
  Matrix<float,_3,_3> *mat;
  long lVar4;
  tcu *this_00;
  Matrix<float,_3,_3> retVal;
  tcu local_44 [36];
  
  this_00 = local_44;
  tcu::Matrix<float,_3,_3>::Matrix((Matrix<float,_3,_3> *)this_00);
  mat = extraout_RDX;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    fVar1 = a->m_data[lVar2];
    ptVar3 = this_00;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      *(float *)ptVar3 = *(float *)(this + lVar4 * 4) * fVar1;
      ptVar3 = ptVar3 + 0xc;
    }
    this_00 = this_00 + 4;
    mat = (Matrix<float,_3,_3> *)0x3;
  }
  tcu::transpose<float,3,3>(__return_storage_ptr__,local_44,mat);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}